

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512bw_blend_popcnt(uint16_t *data,uint32_t len,uint32_t *flags)

{
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 uVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  int j;
  int i_1;
  __m512i input1;
  __m512i input0;
  __m512i v1;
  __m512i v0;
  size_t i;
  uint32_t n_cycles;
  __m512i *data_vectors;
  undefined4 local_548;
  undefined4 local_544;
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined8 local_408;
  
  for (local_408 = 0; local_408 + 2 <= (ulong)(in_ESI >> 5); local_408 = local_408 + 2) {
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_408 * 0x40));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x40 + local_408 * 0x40));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar2);
    auVar5 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsllw_avx512bw(auVar5,ZEXT416(8));
    auVar5 = vpternlogd_avx512f(auVar4,auVar6,auVar5,0xea);
    local_500 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrlw_avx512bw(auVar2,ZEXT416(8));
    auVar2 = vpternlogd_avx512f(auVar5,auVar4,auVar2,0xea);
    local_540 = vmovdqa64_avx512f(auVar2);
    for (local_544 = 0; local_544 < 8; local_544 = local_544 + 1) {
      auVar2 = vmovdqa64_avx512f(local_500);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(auVar2);
      uVar1 = vpmovb2m_avx512bw(auVar2);
      *(int *)(in_RDX + (long)(7 - local_544) * 4) =
           *(int *)(in_RDX + (long)(7 - local_544) * 4) + (int)POPCOUNT(uVar1);
      auVar2 = vmovdqa64_avx512f(local_540);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(auVar2);
      uVar1 = vpmovb2m_avx512bw(auVar2);
      *(int *)(in_RDX + (long)(0xf - local_544) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_544) * 4) + (int)POPCOUNT(uVar1);
      auVar2 = vmovdqa64_avx512f(local_500);
      auVar3 = vmovdqa64_avx512f(local_500);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vpaddb_avx512bw(auVar2,auVar3);
      local_500 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(local_540);
      auVar3 = vmovdqa64_avx512f(local_540);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vpaddb_avx512bw(auVar2,auVar3);
      local_540 = vmovdqa64_avx512f(auVar2);
    }
  }
  for (local_408 = local_408 << 5; local_408 < in_ESI; local_408 = local_408 + 1) {
    for (local_548 = 0; local_548 < 0x10; local_548 = local_548 + 1) {
      *(int *)(in_RDX + (long)local_548 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_408 * 2) & 1 << ((byte)local_548 & 0x1f)) >>
           ((byte)local_548 & 0x1f)) + *(int *)(in_RDX + (long)local_548 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m512i v0 = _mm512_loadu_si512(data_vectors + i + 0);
        __m512i v1 = _mm512_loadu_si512(data_vectors + i + 1);

        __m512i input0 = _mm512_ternarylogic_epi32(v0, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v1, 8), AND_OR);
        __m512i input1 = _mm512_ternarylogic_epi32(v0, _mm512_set1_epi16(0xFF00), _mm512_srli_epi16(v1, 8), AND_OR);
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input0));
            flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input1));
            input0 = _mm512_add_epi8(input0, input0);
            input1 = _mm512_add_epi8(input1, input1);
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    return 0;
}